

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  PendingList *pOld;
  long lVar5;
  
  pOld = *pp;
  if (pOld == (PendingList *)0x0) {
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      pOld = (PendingList *)sqlite3Malloc(0x94);
    }
    else {
      pOld = (PendingList *)0x0;
    }
    if (pOld == (PendingList *)0x0) {
      return 7;
    }
    pOld->nSpace = 100;
    pOld->aData = (char *)(pOld + 1);
    pOld->nData = 0;
  }
  else if (pOld->nSpace < pOld->nData + 0xb) {
    lVar5 = (long)pOld->nSpace * 2;
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      pOld = (PendingList *)sqlite3Realloc(pOld,lVar5 + 0x30);
    }
    else {
      pOld = (PendingList *)0x0;
    }
    if (pOld == (PendingList *)0x0) {
      sqlite3_free(*pp);
      *pp = (PendingList *)0x0;
      return 7;
    }
    pOld->nSpace = (int)lVar5;
    pOld->aData = (char *)(pOld + 1);
  }
  iVar4 = pOld->nData;
  pcVar1 = pOld->aData;
  lVar5 = 0;
  do {
    bVar3 = (byte)i;
    pcVar1[lVar5 + iVar4] = bVar3 | 0x80;
    lVar5 = lVar5 + 1;
    bVar2 = 0x7f < (ulong)i;
    i = (ulong)i >> 7;
  } while (bVar2);
  pcVar1[lVar5 + (long)iVar4 + -1] = bVar3;
  iVar4 = pOld->nData;
  pOld->nData = iVar4 + (int)lVar5;
  pOld->aData[lVar5 + iVar4] = '\0';
  *pp = pOld;
  return 0;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc64(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    i64 nNew = p->nSpace * 2;
    p = sqlite3_realloc64(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = (int)nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}